

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_ignore_zeros.c
# Opt level: O3

void test_option_ignore_zeros_mode_c(void)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = make_files();
  if (iVar1 != 0) {
    return;
  }
  wVar2 = systemf("%s cf abc.tar --ignore-zeros @ab-cat.tar -C in c > test-c.out 2> test-c.err",
                  testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
                      ,L'V',0,"0",(long)wVar2,
                      "systemf( \"%s cf abc.tar --ignore-zeros @ab-cat.tar -C in c \" \"> test-c.out 2> test-c.err\", testprog)"
                      ,(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'W',"test-c.err");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'X',"test-c.out");
  wVar2 = systemf("%s xf abc.tar -C out > test-x.out 2> test-x.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
                      ,L'\\',0,"0",(long)wVar2,
                      "systemf( \"%s xf abc.tar -C out > test-x.out 2> test-x.err\", testprog)",
                      (void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L']',"test-x.err");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'^',"test-x.out");
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'`',"out/a","in/a");
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'a',"out/b","in/b");
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'b',"out/c","in/c");
  return;
}

Assistant:

DEFINE_TEST(test_option_ignore_zeros_mode_c)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	// The first command run by systemf below prints this to stderr:
	// bsdtar.exe: a: Can't translate uname '(null)' to UTF-8
	// bsdtar.exe: b: Can't translate uname '(null)' to UTF-8
	skipping("TODO: figure out why this test fails on github workflows with MSVC");
	return;
#else
	if (make_files())
		return;

	assertEqualInt(0, systemf(
	    "%s cf abc.tar --ignore-zeros @ab-cat.tar -C in c "
	    "> test-c.out 2> test-c.err",
	    testprog));
	assertEmptyFile("test-c.err");
	assertEmptyFile("test-c.out");

	assertEqualInt(0, systemf(
	    "%s xf abc.tar -C out > test-x.out 2> test-x.err",
	    testprog));
	assertEmptyFile("test-x.err");
	assertEmptyFile("test-x.out");

	assertEqualFile("out/a", "in/a");
	assertEqualFile("out/b", "in/b");
	assertEqualFile("out/c", "in/c");
#endif
}